

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoleculeStamp.cpp
# Opt level: O2

bool __thiscall
OpenMD::MoleculeStamp::addInversionStamp(MoleculeStamp *this,InversionStamp *inversion)

{
  InversionStamp *local_8;
  
  local_8 = inversion;
  std::vector<OpenMD::InversionStamp_*,_std::allocator<OpenMD::InversionStamp_*>_>::push_back
            (&this->inversionStamps_,&local_8);
  return true;
}

Assistant:

bool MoleculeStamp::addInversionStamp(InversionStamp* inversion) {
    inversionStamps_.push_back(inversion);
    return true;
  }